

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<int> * __thiscall QList<int>::fill(QList<int> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  QArrayData *data;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int copy;
  ulong uVar9;
  long in_FS_OFFSET;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  lVar6 = newSize;
  if (pDVar1 != (Data *)0x0) {
    lVar6 = (pDVar1->super_QArrayData).alloc;
    if (newSize <= lVar6 &&
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      lVar6 = (this->d).size;
      lVar7 = newSize;
      if (lVar6 < newSize) {
        lVar7 = lVar6;
      }
      if (lVar7 != 0) {
        piVar5 = (this->d).ptr;
        lVar6 = 0;
        do {
          *(parameter_type *)((long)piVar5 + lVar6) = t;
          lVar6 = lVar6 + 4;
        } while (lVar7 * 4 != lVar6);
        lVar6 = (this->d).size;
      }
      lVar7 = newSize - lVar6;
      if (lVar7 == 0 || newSize < lVar6) {
        if (newSize < lVar6) {
          (this->d).size = newSize;
        }
      }
      else {
        piVar5 = (this->d).ptr;
        (this->d).size = newSize;
        auVar4 = _DAT_004c9270;
        auVar3 = _DAT_004c9260;
        auVar2 = _DAT_004c80d0;
        lVar8 = lVar7 + -1;
        auVar14._8_4_ = (int)lVar8;
        auVar14._0_8_ = lVar8;
        auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar14 = auVar14 ^ _DAT_004c80d0;
        do {
          auVar13._8_4_ = (int)uVar9;
          auVar13._0_8_ = uVar9;
          auVar13._12_4_ = (int)(uVar9 >> 0x20);
          auVar10 = (auVar13 | auVar4) ^ auVar2;
          iVar11 = auVar14._4_4_;
          if ((bool)(~(auVar10._4_4_ == iVar11 && auVar14._0_4_ < auVar10._0_4_ ||
                      iVar11 < auVar10._4_4_) & 1)) {
            piVar5[lVar6 + uVar9] = t;
          }
          if ((auVar10._12_4_ != auVar14._12_4_ || auVar10._8_4_ <= auVar14._8_4_) &&
              auVar10._12_4_ <= auVar14._12_4_) {
            piVar5[lVar6 + uVar9 + 1] = t;
          }
          auVar13 = (auVar13 | auVar3) ^ auVar2;
          iVar15 = auVar13._4_4_;
          if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar13._0_4_ <= auVar14._0_4_)) {
            piVar5[lVar6 + uVar9 + 2] = t;
            piVar5[lVar6 + uVar9 + 3] = t;
          }
          uVar9 = uVar9 + 4;
        } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar9);
      }
      goto LAB_0047f70e;
    }
    if (lVar6 <= newSize) {
      lVar6 = newSize;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar6 = newSize;
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  piVar5 = (int *)QArrayData::allocate(&local_30,4,0x10,lVar6,KeepSize);
  auVar4 = _DAT_004c9270;
  auVar3 = _DAT_004c9260;
  auVar2 = _DAT_004c80d0;
  if (newSize != 0) {
    lVar6 = newSize + -1;
    auVar10._8_4_ = (int)lVar6;
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_004c80d0;
    do {
      auVar12._8_4_ = (int)uVar9;
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = (int)(uVar9 >> 0x20);
      auVar14 = (auVar12 | auVar4) ^ auVar2;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar11 && auVar10._0_4_ < auVar14._0_4_ ||
                  iVar11 < auVar14._4_4_) & 1)) {
        piVar5[uVar9] = t;
      }
      if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
          auVar14._12_4_ <= auVar10._12_4_) {
        piVar5[uVar9 + 1] = t;
      }
      auVar14 = (auVar12 | auVar3) ^ auVar2;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar14._0_4_ <= auVar10._0_4_)) {
        piVar5[uVar9 + 2] = t;
        piVar5[uVar9 + 3] = t;
      }
      uVar9 = uVar9 + 4;
    } while ((newSize + 3U & 0xfffffffffffffffc) != uVar9);
  }
  data = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_30;
  (this->d).ptr = piVar5;
  (this->d).size = newSize;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,4,0x10);
    }
  }
LAB_0047f70e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}